

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileFStream::Open
          (FileFStream *this,string *name,Mode openMode,bool async,bool directio)

{
  string *__rhs;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Result<void> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Ios_Openmode _Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *process;
  __allocator_type __a2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  __state_type local_178;
  element_type *local_160;
  __allocator_type __a2_1;
  thread local_150;
  undefined8 local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_140 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  (this->super_Transport).m_OpenMode = openMode;
  _Var4 = (_Ios_Openmode)name;
  if (openMode == Append) {
    std::__cxx11::string::string((string *)&local_90,"open",(allocator *)&local_198);
    Transport::ProfilerStart(&this->super_Transport,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::fstream::open((string *)&this->m_FileStream,_Var4);
    std::ostream::seekp((long)&this->field_0x100,_S_beg);
    process = &local_b0;
LAB_005faa40:
    std::__cxx11::string::string((string *)process,"open",(allocator *)&local_198);
    Transport::ProfilerStop(&this->super_Transport,process);
  }
  else {
    if (openMode == Read) {
      std::__cxx11::string::string((string *)&local_d0,"open",(allocator *)&local_198);
      Transport::ProfilerStart(&this->super_Transport,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::fstream::open((string *)&this->m_FileStream,_Var4);
      process = &local_f0;
      goto LAB_005faa40;
    }
    if (openMode == Write) {
      if (async) {
        this->m_IsOpening = true;
        local_178.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_178.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
        p_Var1->_M_use_count = 1;
        p_Var1->_M_weak_count = 1;
        p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00823768;
        p_Var1[1]._M_use_count = 0;
        p_Var1[1]._M_weak_count = 0;
        *(undefined4 *)&p_Var1[2]._vptr__Sp_counted_base = 0;
        *(undefined1 *)((long)&p_Var1[2]._vptr__Sp_counted_base + 4) = 0;
        p_Var1[2]._M_use_count = 0;
        local_198._M_dataplus._M_p = (pointer)&__a2;
        p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var1[3]._M_use_count = 0;
        p_Var3 = p_Var1 + 1;
        p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_008237b8;
        local_198._M_string_length = (size_type)p_Var1;
        p_Var2 = (_Result<void> *)operator_new(0x10);
        *(undefined8 *)p_Var2 = 0;
        *(undefined8 *)&p_Var2->field_0x8 = 0;
        std::__future_base::_Result<void>::_Result(p_Var2);
        p_Var1[4]._vptr__Sp_counted_base = (_func_int **)p_Var2;
        std::__cxx11::string::string((string *)&p_Var1[4]._M_use_count,(string *)name);
        *(FileFStream **)&p_Var1[6]._M_use_count = this;
        local_150._M_id._M_thread = (id)0;
        ___a2_1 = (long *)operator_new(0x20);
        *___a2_1 = (long)&PTR___State_00823810;
        ___a2_1[1] = (long)p_Var3;
        ___a2_1[2] = (long)std::__future_base::
                           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
                           ::_M_run;
        ___a2_1[3] = 0;
        std::thread::_M_start_thread(&local_150,&__a2_1,0);
        local_160 = (element_type *)p_Var3;
        if (___a2_1 != (long *)0x0) {
          (**(code **)(*___a2_1 + 8))();
        }
        std::thread::operator=((thread *)(p_Var1 + 3),&local_150);
        std::thread::~thread(&local_150);
        local_198._M_string_length = 0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileFStream_cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileFStream_cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_198);
        local_198._M_dataplus._M_p =
             (pointer)local_178.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
        local_148 = 0;
        a_Stack_140[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_178.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_160;
        local_198._M_string_length =
             (size_type)
             local_178.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_178.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_140);
        if (local_178.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) {
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
          p_Var3->_M_use_count = 1;
          p_Var3->_M_weak_count = 1;
          p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00823850;
          p_Var3[1]._M_use_count = 0;
          p_Var3[1]._M_weak_count = 0;
          local_198._M_dataplus._M_p = (pointer)&__a2_1;
          *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
          *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
          p_Var3[2]._M_use_count = 0;
          local_160 = (element_type *)(p_Var3 + 1);
          p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_008238a0;
          local_198._M_string_length = (size_type)p_Var3;
          p_Var2 = (_Result<void> *)operator_new(0x10);
          *(undefined8 *)p_Var2 = 0;
          *(undefined8 *)&p_Var2->field_0x8 = 0;
          std::__future_base::_Result<void>::_Result(p_Var2);
          p_Var3[3]._vptr__Sp_counted_base = (_func_int **)p_Var2;
          std::__cxx11::string::string((string *)&p_Var3[3]._M_use_count,(string *)name);
          *(FileFStream **)&p_Var3[5]._M_use_count = this;
          local_198._M_string_length = 0;
          std::
          __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
          ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileFStream_cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileFStream_cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                              *)&local_198);
          local_198._M_dataplus._M_p =
               (pointer)local_178.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
          local_148 = 0;
          a_Stack_140[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_178.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_160;
          local_198._M_string_length =
               (size_type)
               local_178.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          local_178.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var3;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_140);
        }
        std::__basic_future<void>::__basic_future((__basic_future<void> *)&local_198,&local_178);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_178.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::future<void>::operator=(&this->m_OpenFuture,(future<void> *)&local_198);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
        goto LAB_005faa63;
      }
      std::__cxx11::string::string((string *)&local_50,"open",(allocator *)&local_198);
      Transport::ProfilerStart(&this->super_Transport,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::fstream::open((string *)&this->m_FileStream,_Var4);
      process = &local_70;
      goto LAB_005faa40;
    }
    std::operator+(&local_198,"unknown open mode for file ",__rhs);
    std::operator+(&local_110,&local_198,", in call to stream open");
    CheckFile(this,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    process = &local_198;
  }
  std::__cxx11::string::~string((string *)process);
LAB_005faa63:
  if (this->m_IsOpening == false) {
    std::operator+(&local_198,"couldn\'t open file ",__rhs);
    std::operator+(&local_130,&local_198,
                   ", check permissions or path existence, in call to fstream open");
    CheckFile(this,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_198);
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FileFStream::Open(const std::string &name, const Mode openMode, const bool async,
                       const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> void {
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
        ProfilerStop("open");
    };
    m_Name = name;
    CheckName();
    m_OpenMode = openMode;

    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            ProfilerStart("open");
            m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::out | std::fstream::binary);
        m_FileStream.seekp(0, std::ios_base::end);
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::binary);
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to stream open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to fstream open");
        m_IsOpen = true;
    }
}